

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::AddToSpends(CWallet *this,CWalletTx *wtx,WalletBatch *batch)

{
  bool bVar1;
  const_iterator outpoint;
  const_iterator wtxid;
  WalletBatch *in_RDI;
  long in_FS_OFFSET;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  CWalletTx *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  WalletBatch *batch_00;
  CWallet *this_00;
  
  this_00 = *(CWallet **)(in_FS_OFFSET + 0x28);
  batch_00 = in_RDI;
  bVar1 = CWalletTx::IsCoinBase(in_stack_ffffffffffffffa8);
  if (!bVar1) {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffffa8);
    outpoint = std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                         ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffffb0);
    wtxid = std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffffb0);
    while (bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_ffffffffffffffb0), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffffb0 =
           __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
           ::operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_ffffffffffffffa8);
      CWalletTx::GetHash(in_stack_ffffffffffffffa8);
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)in_stack_ffffffffffffffa8);
      AddToSpends(this_00,&(outpoint._M_current)->prevout,(uint256 *)wtxid._M_current,batch_00);
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 in_stack_ffffffffffffffa8);
    }
  }
  if (*(CWallet **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::AddToSpends(const CWalletTx& wtx, WalletBatch* batch)
{
    if (wtx.IsCoinBase()) // Coinbases don't spend anything!
        return;

    for (const CTxIn& txin : wtx.tx->vin)
        AddToSpends(txin.prevout, wtx.GetHash(), batch);
}